

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O1

Value __thiscall xmrig::CudaBackend::toJSON(CudaBackend *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  CudaBackend *this_00;
  byte bVar4;
  size_t sVar5;
  Data *pDVar6;
  char *str;
  Document *pDVar7;
  size_t threadId;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t version;
  Document *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  undefined8 extraout_RDX_01;
  Document *doc_00;
  uint uVar9;
  Stack<rapidjson::CrtAllocator> *pSVar10;
  undefined1 auVar11 [16];
  Value VVar12;
  Value threads;
  Value versions;
  Data local_d8;
  Data local_c8;
  CudaBackend *local_b8;
  Document *local_b0;
  Data local_a8;
  undefined1 local_98 [16];
  Data local_88;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = in_RDX->allocator_;
  (this->super_IBackend)._vptr_IBackend = (_func_int **)0x0;
  this->d_ptr = (CudaBackendPrivate *)0x0;
  *(undefined2 *)((long)&this->d_ptr + 6) = 3;
  local_b8 = this;
  local_b0 = in_RDX;
  (**(code **)((doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.n.i64 + 0x28))(doc);
  String::toJSON((String *)&local_c8.s);
  this_00 = local_b8;
  local_a8.s.str = (Ch *)0x40500000018d27a;
  local_a8.n = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_b8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,allocator);
  bVar4 = (**(code **)((doc->
                       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ).data_.n.i64 + 0x10))(doc);
  local_c8.s.str = (Ch *)0x40500000018a227;
  local_c8.n = (Number)0x7;
  local_a8.n = (Number)0x0;
  local_a8.s.str = (Ch *)((ulong)(ushort)(bVar4 + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this_00,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,allocator);
  uVar8 = extraout_RDX;
  if (CudaLib::m_ready == '\x01') {
    local_88.n.i64 = (Number)0x0;
    local_88.s.str = (Ch *)0x3000000000000;
    CudaLib::version_abi_cxx11_
              ((string *)&local_a8.s,
               (CudaLib *)
               (ulong)*(uint *)((doc->
                                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ).data_.s.str + 0x5c),(uint32_t)extraout_RDX);
    uVar8 = local_a8.n;
    local_d8.n = (Number)0x0;
    local_d8.s.str = (Ch *)0x0;
    sVar5 = strlen((char *)local_a8.n);
    uVar9 = (uint)sVar5;
    if (uVar9 < 0xe) {
      pDVar6 = &local_d8;
      local_d8.ss.str[0xd] = '\r' - (char)sVar5;
      local_d8.f.flags = 0x1c05;
    }
    else {
      local_d8.f.flags = 0xc05;
      local_d8.s.length = uVar9;
      pDVar6 = (Data *)rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                                 (allocator,(ulong)(uVar9 + 1));
      local_d8.s.str = (Ch *)((ulong)local_d8.s.str & 0xffff000000000000 | (ulong)pDVar6);
    }
    memcpy(pDVar6,(void *)uVar8,sVar5 & 0xffffffff);
    *(undefined1 *)((long)pDVar6 + (sVar5 & 0xffffffff)) = 0;
    local_c8.s.str = (Ch *)0x40500000018f1ff;
    local_c8.n = (Number)0xc;
    pDVar6 = &local_d8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&pDVar6->s,allocator);
    version = extraout_EDX;
    if (local_a8.n.i64 != (Number)local_98) {
      operator_delete((void *)local_a8.n);
      version = extraout_EDX_00;
    }
    CudaLib::version_abi_cxx11_
              ((string *)&local_a8.s,
               (CudaLib *)
               (ulong)*(uint *)((doc->
                                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ).data_.s.str + 0x58),version);
    uVar8 = local_a8.n;
    local_d8.n.i64 = (Number)0x0;
    local_d8.s.str = (Ch *)0x0;
    sVar5 = strlen((char *)local_a8.n);
    uVar9 = (uint)sVar5;
    if (uVar9 < 0xe) {
      local_d8.ss.str[0xd] = '\r' - (char)sVar5;
      local_d8.f.flags = 0x1c05;
    }
    else {
      local_d8.f.flags = 0xc05;
      local_d8.s.length = uVar9;
      pDVar6 = (Data *)rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                                 (allocator,(ulong)(uVar9 + 1));
      local_d8.s.str = (Ch *)((ulong)local_d8.s.str & 0xffff000000000000 | (ulong)pDVar6);
    }
    memcpy(pDVar6,(void *)uVar8,sVar5 & 0xffffffff);
    *(undefined1 *)((long)&(pDVar6->s).length + (sVar5 & 0xffffffff)) = 0;
    local_c8.s.str = (Ch *)0x40500000018f20c;
    local_c8.n.i64 = (Number)0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_d8.s,allocator);
    if (local_a8.n.i64 != (Number)local_98) {
      operator_delete((void *)local_a8.n);
    }
    str = CudaLib::pluginVersion();
    String::String((String *)&local_d8.s,str);
    String::toJSON((String *)&local_c8.s,(Document *)&local_d8.s);
    local_a8.s.str = (Ch *)0x40500000018f218;
    local_a8.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,allocator);
    if (local_d8.n.i64 != 0) {
      operator_delete__((void *)local_d8.n);
    }
    if (NvmlLib::m_ready == '\x01') {
      local_40.s = "nvml";
      local_40.length = 4;
      local_50.s = NvmlLib::m_nvmlVersion;
      sVar5 = strlen(NvmlLib::m_nvmlVersion);
      local_50.length = (SizeType)sVar5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_88.s,&local_40,&local_50,allocator);
      local_60.s = "driver";
      local_60.length = 6;
      local_70.s = NvmlLib::m_driverVersion;
      sVar5 = strlen(NvmlLib::m_driverVersion);
      local_70.length = (SizeType)sVar5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_88.s,&local_60,&local_70,allocator);
    }
    local_a8.s.str = (Ch *)0x40500000018f21f;
    local_a8.n.i64 = (Number)0x8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_b8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_a8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,allocator);
    uVar8 = extraout_RDX_00;
  }
  pCVar1 = (doc->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  if (*(long *)(pCVar1 + 0x40) != *(long *)(pCVar1 + 0x48)) {
    auVar11 = (**(code **)((doc->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_.n.i64 + 0x20))(doc);
    uVar8 = auVar11._8_8_;
    if (auVar11._0_8_ != 0) {
      pDVar7 = (Document *)
               (**(code **)((doc->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ).data_.n.i64 + 0x20))(doc);
      Hashrate::toJSON((Hashrate *)&local_c8.s,pDVar7);
      local_a8.s.str = (Ch *)0x40500000018da86;
      local_a8.n = (Number)0x8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_b8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,allocator);
      local_c8.n = (Number)0x0;
      local_c8.s.str = (Ch *)0x4000000000000;
      pCVar1 = (doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.s.str;
      puVar2 = *(undefined1 **)(pCVar1 + 0x40);
      puVar3 = *(undefined1 **)(pCVar1 + 0x48);
      if (puVar2 != puVar3) {
        doc_00 = (Document *)0x0;
        pDVar7 = (Document *)(puVar2 + 0x10);
        do {
          CudaThread::toJSON((CudaThread *)&local_88.s,pDVar7);
          threadId = (**(code **)((doc->
                                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  ).data_.n.i64 + 0x20))(doc);
          Hashrate::toJSON((Hashrate *)&local_d8.s,threadId,doc_00);
          local_a8.s.str = (Ch *)0x40500000018da86;
          local_a8.n.i64 = (Number)0x8;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_88.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_a8.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_d8.s,allocator);
          CudaDevice::toJSON((CudaDevice *)pDVar7[-1].parseResult_.offset_,(Value *)&local_88.s,
                             local_b0);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c8.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_88.s,allocator);
          doc_00 = (Document *)
                   ((long)&(doc_00->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_ + 1);
          pSVar10 = &pDVar7->stack_;
          pDVar7 = (Document *)&(pDVar7->stack_).stack_;
        } while (pSVar10 != (Stack<rapidjson::CrtAllocator> *)puVar3);
      }
      local_a8.s.str = (Ch *)0x40500000018a29c;
      local_a8.n = (Number)0x7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_b8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,allocator);
      uVar8 = extraout_RDX_01;
    }
  }
  VVar12.data_.s.str = (Ch *)uVar8;
  VVar12.data_.n = (Number)local_b8;
  return (Value)VVar12.data_;
}

Assistant:

rapidjson::Value xmrig::CudaBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);

    if (CudaLib::isReady()) {
        Value versions(kObjectType);
        versions.AddMember("cuda-runtime",   Value(CudaLib::version(d_ptr->runtimeVersion).c_str(), allocator), allocator);
        versions.AddMember("cuda-driver",    Value(CudaLib::version(d_ptr->driverVersion).c_str(), allocator), allocator);
        versions.AddMember("plugin",         String(CudaLib::pluginVersion()).toJSON(doc), allocator);

#       ifdef XMRIG_FEATURE_NVML
        if (NvmlLib::isReady()) {
            versions.AddMember("nvml",       StringRef(NvmlLib::version()), allocator);
            versions.AddMember("driver",     StringRef(NvmlLib::driverVersion()), allocator);
        }
#       endif

        out.AddMember("versions", versions, allocator);
    }

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const auto &data : d_ptr->threads) {
        Value thread = data.thread.toJSON(doc);
        thread.AddMember("hashrate", hashrate()->toJSON(i, doc), allocator);

        data.device.toJSON(thread, doc);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}